

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  undefined8 uVar1;
  bool bVar2;
  Result RVar3;
  pointer *__ptr;
  undefined1 local_68 [56];
  
  local_68._16_8_ = fields;
  while( true ) {
    bVar2 = PeekMatchLpar(this,Export);
    if (!bVar2) {
      return (Result)Ok;
    }
    RVar3 = Expect(this,Lpar);
    if (RVar3.enum_ == Error) break;
    GetLocation((Location *)(local_68 + 0x18),this);
    std::make_unique<wabt::ExportModuleField,wabt::Location>((Location *)local_68);
    *(ExternalKind *)(local_68._0_8_ + 0x60) = kind;
    RVar3 = Expect(this,Export);
    if (((RVar3.enum_ == Error) ||
        (RVar3 = ParseQuotedText(this,(string *)(local_68._0_8_ + 0x40),true), RVar3.enum_ == Error)
        ) || (RVar3 = Expect(this,Rpar), uVar1 = local_68._0_8_, RVar3.enum_ == Error)) {
      bVar2 = false;
    }
    else {
      local_68._0_8_ = (long *)0x0;
      local_68._8_8_ = uVar1;
      intrusive_list<wabt::ModuleField>::push_back
                ((intrusive_list<wabt::ModuleField> *)local_68._16_8_,
                 (unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                 (local_68 + 8));
      if ((long *)local_68._8_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_68._8_8_ + 8))();
      }
      local_68._8_8_ = (char *)0x0;
      bVar2 = true;
    }
    if ((long *)local_68._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
    if (!bVar2) {
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = std::make_unique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}